

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

HelicsFederate helicsGetFederateByName(char *fedName,HelicsError *err)

{
  size_type sVar1;
  size_t sVar2;
  FedObject *pFVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  HelicsFederate pvVar5;
  char *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  string_view fedName_00;
  string_view newError;
  string_view newError_00;
  shared_ptr<MasterObjectHolder> mob;
  MasterObjectHolder *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  size_type local_80;
  undefined8 uStack_78;
  shared_ptr<helics::Federate> local_70;
  MasterObjectHolder *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  MasterObjectHolder *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (fedName != (char *)0x0) {
      getMasterHolder();
      sVar2 = strlen(fedName);
      fedName_00._M_str = fedName;
      fedName_00._M_len = sVar2;
      pFVar3 = MasterObjectHolder::findFed(local_30,fedName_00);
      if (pFVar3 == (FedObject *)0x0) {
        if (err != (HelicsError *)0x0) {
          err->error_code = -4;
          getMasterHolder();
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          sVar2 = strlen(fedName);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,fedName,fedName + sVar2);
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_50," is not an active federate identifier");
          local_90 = (MasterObjectHolder *)(pbVar4->_M_dataplus)._M_p;
          paVar7 = &pbVar4->field_2;
          if (local_90 == (MasterObjectHolder *)paVar7) {
            local_80 = paVar7->_M_allocated_capacity;
            uStack_78 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
            local_90 = (MasterObjectHolder *)&local_80;
          }
          else {
            local_80 = paVar7->_M_allocated_capacity;
          }
          sVar1 = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          newError_00._M_str = (char *)local_90;
          newError_00._M_len = sVar1;
          pcVar6 = MasterObjectHolder::addErrorString(local_60,newError_00);
          err->message = pcVar6;
          if (local_90 != (MasterObjectHolder *)&local_80) {
            operator_delete(local_90,local_80 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
          }
        }
        pvVar5 = (HelicsFederate)0x0;
      }
      else {
        local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pFVar3->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (pFVar3->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        if (local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        pvVar5 = generateNewHelicsFederateObject(&local_70,pFVar3->type);
        if (local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (local_28 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return pvVar5;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
      return pvVar5;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -4;
      getMasterHolder();
      newError._M_str = "fedName is empty";
      newError._M_len = 0x10;
      pcVar6 = MasterObjectHolder::addErrorString(local_90,newError);
      err->message = pcVar6;
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
    }
  }
  return (HelicsFederate)0x0;
}

Assistant:

HelicsFederate helicsGetFederateByName(const char* fedName, HelicsError* err)
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }
    if (fedName == nullptr) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString("fedName is empty");
        }
        return nullptr;
    }
    auto mob = getMasterHolder();
    auto* fed = mob->findFed(fedName);
    if (fed == nullptr) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString(std::string(fedName) + " is not an active federate identifier");
        }
        return nullptr;
    }
    return generateNewHelicsFederateObject(fed->fedptr, fed->type);
}